

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule::IfcTimeSeriesSchedule(IfcTimeSeriesSchedule *this)

{
  *(undefined ***)&this->field_0x138 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x140 = 0;
  *(char **)&this->field_0x148 = "IfcTimeSeriesSchedule";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__0080e670);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x80e590;
  *(undefined8 *)&this->field_0x138 = 0x80e658;
  *(undefined8 *)&this->field_0x88 = 0x80e5b8;
  *(undefined8 *)&this->field_0x98 = 0x80e5e0;
  *(undefined8 *)&this->field_0xd0 = 0x80e608;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>)._vptr_ObjectHelper
       = (_func_int **)0x80e630;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>).field_0x18 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>).field_0x19 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTimeSeriesSchedule,_3UL>).field_0x21 = 0;
  (this->TimeSeriesScheduleType)._M_dataplus._M_p = (pointer)&(this->TimeSeriesScheduleType).field_2
  ;
  (this->TimeSeriesScheduleType)._M_string_length = 0;
  (this->TimeSeriesScheduleType).field_2._M_local_buf[0] = '\0';
  (this->TimeSeries).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcTimeSeriesSchedule() : Object("IfcTimeSeriesSchedule") {}